

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_logger.cpp
# Opt level: O3

bool __thiscall juzzlin::SimpleLogger::Impl::shouldFlush(Impl *this)

{
  bool bVar1;
  long *local_30;
  long local_28;
  long local_20 [2];
  
  if ((int)this->m_activeLevel < m_level) {
    bVar1 = false;
  }
  else {
    std::__cxx11::stringbuf::str();
    bVar1 = local_28 != 0;
    if (local_30 != local_20) {
      operator_delete(local_30,local_20[0] + 1);
    }
  }
  return bVar1;
}

Assistant:

bool SimpleLogger::Impl::shouldFlush() const
{
    return m_activeLevel >= m_level && !m_message.str().empty();
}